

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::HttpServer::SuspendedRequest::SuspendedRequest
          (SuspendedRequest *this,Array<unsigned_char> *bufferParam,
          ArrayPtr<unsigned_char> leftoverParam,OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method
          ,StringPtr url,HttpHeaders *headers)

{
  bool bVar1;
  Array<unsigned_char> *other;
  HttpHeaders *pHVar2;
  size_t sVar3;
  uchar *puVar4;
  uchar *puVar5;
  bool local_1f2;
  bool local_1c2;
  bool local_192;
  Fault local_130;
  Fault f_2;
  uchar *local_120;
  uchar *local_118;
  DebugComparison<unsigned_char_*,_unsigned_char_*> local_110;
  bool local_e1;
  bool _kjCondition_2;
  Fault f_1;
  uchar *local_d0;
  uchar *local_c8;
  DebugComparison<unsigned_char_*,_unsigned_char_*> local_c0;
  bool local_91;
  bool _kjCondition_1;
  Fault f;
  uchar *local_80;
  uchar *local_78;
  DebugComparison<unsigned_char_*,_unsigned_char_*> local_70;
  bool local_45 [8];
  bool _kjCondition;
  HttpHeaders *local_38;
  HttpHeaders *headers_local;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method_local;
  Array<unsigned_char> *bufferParam_local;
  SuspendedRequest *this_local;
  ArrayPtr<unsigned_char> leftoverParam_local;
  
  leftoverParam_local.ptr = (uchar *)leftoverParam.size_;
  this_local = (SuspendedRequest *)leftoverParam.ptr;
  local_38 = headers;
  headers_local = (HttpHeaders *)method;
  method_local = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)bufferParam;
  bufferParam_local = &this->buffer;
  other = mv<kj::Array<unsigned_char>>(bufferParam);
  Array<unsigned_char>::Array(&this->buffer,other);
  (this->leftover).ptr = (uchar *)this_local;
  (this->leftover).size_ = (size_t)leftoverParam_local.ptr;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::OneOf(&this->method,method);
  (this->url).content.ptr = url.content.ptr;
  (this->url).content.size_ = url.content.size_;
  pHVar2 = mv<kj::HttpHeaders>(headers);
  HttpHeaders::HttpHeaders(&this->headers,pHVar2);
  sVar3 = ArrayPtr<unsigned_char>::size(&this->leftover);
  if (sVar3 == 0) {
    local_120 = ArrayPtr<unsigned_char>::begin(&this->leftover);
    local_118 = (uchar *)kj::_::DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_120);
    f_2.exception = (Exception *)Array<unsigned_char>::begin(&this->buffer);
    kj::_::DebugExpression<unsigned_char*>::operator>=
              (&local_110,(DebugExpression<unsigned_char*> *)&local_118,(uchar **)&f_2);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_110);
    local_1f2 = false;
    if (bVar1) {
      puVar4 = ArrayPtr<unsigned_char>::begin(&this->leftover);
      puVar5 = Array<unsigned_char>::end(&this->buffer);
      local_1f2 = puVar4 <= puVar5;
    }
    local_e1 = local_1f2;
    if (local_1f2 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                (&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x2045,FAILED,
                 "leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end()",
                 "_kjCondition,",&local_e1);
      kj::_::Debug::Fault::fatal(&local_130);
    }
  }
  else {
    local_80 = ArrayPtr<unsigned_char>::begin(&this->leftover);
    local_78 = (uchar *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_80);
    f.exception = (Exception *)Array<unsigned_char>::begin(&this->buffer);
    kj::_::DebugExpression<unsigned_char*>::operator>=
              (&local_70,(DebugExpression<unsigned_char*> *)&local_78,(uchar **)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_70);
    local_192 = false;
    if (bVar1) {
      puVar4 = ArrayPtr<unsigned_char>::begin(&this->leftover);
      puVar5 = Array<unsigned_char>::end(&this->buffer);
      local_192 = puVar4 <= puVar5;
    }
    local_45[0] = local_192;
    if (local_192 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                ((Fault *)&stack0xffffffffffffff70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x203f,FAILED,
                 "leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end()",
                 "_kjCondition,",local_45);
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff70);
    }
    local_d0 = ArrayPtr<unsigned_char>::end(&this->leftover);
    local_c8 = (uchar *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d0);
    f_1.exception = (Exception *)Array<unsigned_char>::begin(&this->buffer);
    kj::_::DebugExpression<unsigned_char*>::operator>=
              (&local_c0,(DebugExpression<unsigned_char*> *)&local_c8,(uchar **)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_c0);
    local_1c2 = false;
    if (bVar1) {
      puVar4 = ArrayPtr<unsigned_char>::end(&this->leftover);
      puVar5 = Array<unsigned_char>::end(&this->buffer);
      local_1c2 = puVar4 <= puVar5;
    }
    local_91 = local_1c2;
    if (local_1c2 == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                ((Fault *)&stack0xffffffffffffff20,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x2040,FAILED,"leftover.end() >= buffer.begin() && leftover.end() <= buffer.end()"
                 ,"_kjCondition,",&local_91);
      kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff20);
    }
  }
  return;
}

Assistant:

HttpServer::SuspendedRequest::SuspendedRequest(
    kj::Array<byte> bufferParam, kj::ArrayPtr<byte> leftoverParam,
    kj::OneOf<HttpMethod, HttpConnectMethod> method,
    kj::StringPtr url, HttpHeaders headers)
    : buffer(kj::mv(bufferParam)),
      leftover(leftoverParam),
      method(method),
      url(url),
      headers(kj::mv(headers)) {
  if (leftover.size() > 0) {
    // We have a `leftover`; make sure it is a slice of `buffer`.
    KJ_ASSERT(leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end());
    KJ_ASSERT(leftover.end() >= buffer.begin() && leftover.end() <= buffer.end());
  } else {
    // We have no `leftover`, but we still expect it to point into `buffer` somewhere. This is
    // important so that `messageHeaderEnd` is initialized correctly in HttpInputStreamImpl's
    // constructor.
    KJ_ASSERT(leftover.begin() >= buffer.begin() && leftover.begin() <= buffer.end());
  }
}